

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_int16 *
ma_dr_flac_open_file_and_read_pcm_frames_s16
          (char *filename,uint *channels,uint *sampleRate,ma_uint64 *totalPCMFrameCount,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_dr_flac *pFlac;
  ma_int16 *pmVar1;
  
  if (sampleRate != (uint *)0x0) {
    *sampleRate = 0;
  }
  if (channels != (uint *)0x0) {
    *channels = 0;
  }
  if (totalPCMFrameCount != (ma_uint64 *)0x0) {
    *totalPCMFrameCount = 0;
  }
  pFlac = ma_dr_flac_open_file(filename,pAllocationCallbacks);
  if (pFlac != (ma_dr_flac *)0x0) {
    pmVar1 = ma_dr_flac__full_read_and_close_s16(pFlac,channels,sampleRate,totalPCMFrameCount);
    return pmVar1;
  }
  return (ma_int16 *)0x0;
}

Assistant:

MA_API ma_int16* ma_dr_flac_open_file_and_read_pcm_frames_s16(const char* filename, unsigned int* channels, unsigned int* sampleRate, ma_uint64* totalPCMFrameCount, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (sampleRate) {
        *sampleRate = 0;
    }
    if (channels) {
        *channels = 0;
    }
    if (totalPCMFrameCount) {
        *totalPCMFrameCount = 0;
    }
    pFlac = ma_dr_flac_open_file(filename, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_s16(pFlac, channels, sampleRate, totalPCMFrameCount);
}